

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_basics.cpp
# Opt level: O3

void add_inter_to_all_wins_list
               (Am_Object *inter,float main_priority,int second_priority,int third_priority)

{
  Am_Priority_List *this;
  Am_Object local_28;
  
  this = all_wins_inter_list;
  Am_Object::Am_Object(&local_28,inter);
  Am_Priority_List::Add(this,&local_28,main_priority,second_priority,third_priority);
  Am_Object::~Am_Object(&local_28);
  return;
}

Assistant:

void
add_inter_to_all_wins_list(Am_Object inter, float main_priority,
                           int second_priority, int third_priority)
{
  Am_INTER_TRACE_PRINT(
      Am_INTER_TRACE_PRIORITIES,
      "Adding inter "
          << inter << " to global list for Am_MULTI_OWNERS=true at priority ("
          << main_priority << "," << second_priority << "," << third_priority
          << ")");
  all_wins_inter_list->Add(inter, main_priority, second_priority,
                           third_priority);
}